

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
JointActionDiscrete::ConstructIndividualActionDiscretesIndices(JointActionDiscrete *this)

{
  bool bVar1;
  reference ppAVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index index;
  const_iterator last;
  const_iterator it;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *iv;
  undefined4 in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffff9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa9941f);
  local_20._M_current =
       (ActionDiscrete **)
       std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::begin
                 ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::end
            ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)), bVar1
        ) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffff9c = DiscreteEntity::GetIndex(&(*ppAVar2)->super_DiscreteEntity);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_RSI,(value_type_conflict1 *)this_00);
    __gnu_cxx::
    __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
    ::operator++((__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  }
  return this_00;
}

Assistant:

vector<Index> JointActionDiscrete::ConstructIndividualActionDiscretesIndices() const
{
    vector<Index> iv;
    vector<const ActionDiscrete*>::const_iterator it = _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last = _m_apVector.end();
    while(it != last)
    {
        
        Index index = (*it)->GetIndex();
        iv.push_back( index );
        it++;
    }
    return(iv);
}